

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O3

void __thiscall
imrt::Collimator::Collimator
          (Collimator *this,
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *coord_files)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  double dVar3;
  iterator __position;
  iterator iVar4;
  pointer pdVar5;
  pointer ppVar6;
  pointer ppVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  pointer ppVar11;
  _List_node_base *p_Var12;
  istream *piVar13;
  vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *this_00;
  _Base_ptr p_Var14;
  vector<double,std::allocator<double>> *pvVar15;
  mapped_type *pmVar16;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var17;
  mapped_type *pmVar18;
  mapped_type *pmVar19;
  mapped_type *pmVar20;
  runtime_error *this_01;
  int iVar21;
  _Base_ptr p_Var22;
  ulong uVar23;
  _Rb_tree_header *p_Var24;
  long lVar25;
  int j;
  ulong uVar26;
  bool bVar27;
  double y;
  double x;
  int angle;
  string linec;
  string line;
  stringstream ss;
  ifstream myfile;
  double local_450;
  double local_448;
  int local_43c;
  map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
  *local_438;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_430;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_428;
  char *local_420;
  undefined8 local_418;
  char local_410 [16];
  ulong local_400;
  _Rb_tree_header *local_3f8;
  pair<double,_double> local_3f0;
  undefined1 *local_3e0;
  undefined8 local_3d8;
  undefined1 local_3d0 [16];
  long local_3c0 [3];
  string local_3a8 [104];
  ios_base local_340 [264];
  long local_238 [65];
  
  p_Var24 = &(this->beam_coord)._M_t._M_impl.super__Rb_tree_header;
  (this->beam_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->beam_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->beam_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var24->_M_header;
  (this->beam_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var24->_M_header;
  (this->beam_coord)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_438 = &this->angle_coord;
  p_Var1 = &(this->angle_coord)._M_t._M_impl.super__Rb_tree_header;
  (this->angle_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->angle_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->angle_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->angle_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header;
  (this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->angle_coord)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_428 = &this->nb_angle_beamlets;
  p_Var1 = &(this->nb_angle_beamlets)._M_t._M_impl.super__Rb_tree_header;
  (this->nb_angle_beamlets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nb_angle_beamlets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nb_angle_beamlets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->nb_angle_beamlets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->nb_angle_beamlets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->angles).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)&this->angles;
  (this->angles).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)&this->angles;
  (this->angles).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  (this->coord_files).
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->coord_files).
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->coord_files).
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->reference)._M_t._M_impl.super__Rb_tree_header;
  (this->reference)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->reference)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->reference)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->reference)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->intensity_to_levels)._M_t._M_impl.super__Rb_tree_header;
  (this->intensity_to_levels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->intensity_to_levels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->reference)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->levels_to_intensity).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->levels_to_intensity).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->levels_to_intensity).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->intensity_to_levels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->intensity_to_levels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->intensity_to_levels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_430 = coord_files;
  std::ifstream::ifstream(local_238);
  local_3e0 = local_3d0;
  local_3d8 = 0;
  local_3d0[0] = 0;
  local_420 = local_410;
  local_418 = 0;
  local_410[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
  ppVar11 = (local_430->
            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((local_430->
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppVar11) {
    uVar26 = 0;
    local_3f8 = p_Var24;
    do {
      local_43c = ppVar11[uVar26].first;
      local_400 = uVar26;
      p_Var12 = (_List_node_base *)operator_new(0x18);
      *(int *)&p_Var12[1]._M_next = local_43c;
      std::__detail::_List_node_base::_M_hook(p_Var12);
      psVar2 = &(this->angles).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
      *psVar2 = *psVar2 + 1;
      std::ifstream::open((string *)local_238,
                          (int)(local_430->
                               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + (int)uVar26 * 0x28 +
                          _S_in);
      cVar9 = std::__basic_file<char>::is_open();
      if (cVar9 == '\0') {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"error reading file.");
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      while( true ) {
        cVar9 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                (char)(istream *)local_238);
        piVar13 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)local_238,(string *)&local_3e0,cVar9);
        if (((byte)piVar13[*(long *)(*(long *)piVar13 + -0x18) + 0x20] & 5) != 0) break;
        std::ios::clear((int)*(undefined8 *)(local_3c0[0] + -0x18) + (int)local_3c0);
        std::__cxx11::stringbuf::str(local_3a8);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_3c0,(string *)&local_420,'\t');
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_3c0,(string *)&local_420,'\t');
        local_448 = atof(local_420);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_3c0,(string *)&local_420,'\t');
        local_450 = atof(local_420);
        this_00 = (vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                  std::
                  map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
                  ::operator[](local_438,&local_43c);
        local_3f0.first = local_448;
        local_3f0.second = local_450;
        __position._M_current = *(pair<double,_double> **)(this_00 + 8);
        if (__position._M_current == *(pair<double,_double> **)(this_00 + 0x10)) {
          std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
          _M_realloc_insert<std::pair<double,double>>(this_00,__position,&local_3f0);
        }
        else {
          (__position._M_current)->first = local_448;
          (__position._M_current)->second = local_450;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
        }
        p_Var14 = (this->beam_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var22 = &p_Var24->_M_header;
        if (p_Var14 == (_Base_ptr)0x0) {
LAB_00121699:
          pvVar15 = (vector<double,std::allocator<double>> *)
                    std::
                    map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                    ::operator[](&this->beam_coord,&local_448);
          iVar4._M_current = *(double **)(pvVar15 + 8);
          if (iVar4._M_current == *(double **)(pvVar15 + 0x10)) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      (pvVar15,iVar4,&local_450);
          }
          else {
            *iVar4._M_current = local_450;
            *(double **)(pvVar15 + 8) = iVar4._M_current + 1;
          }
          insertXorder(this,local_448);
        }
        else {
          do {
            bVar27 = local_448 != *(double *)(p_Var14 + 1);
            bVar8 = *(double *)(p_Var14 + 1) <= local_448;
            if (!bVar8 || !bVar27) {
              p_Var22 = p_Var14;
            }
            p_Var14 = (&p_Var14->_M_left)[bVar8 && bVar27];
          } while (p_Var14 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var22 == p_Var24) ||
             (local_448 < (double)((_Rb_tree_header *)p_Var22)->_M_node_count)) goto LAB_00121699;
          pmVar16 = std::
                    map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                    ::operator[](&this->beam_coord,&local_448);
          pdVar5 = (pmVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pmVar16 = std::
                    map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                    ::operator[](&this->beam_coord,&local_448);
          _Var17 = std::
                   __find_if<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_equals_val<double_const>>
                             (pdVar5,(pmVar16->super__Vector_base<double,_std::allocator<double>_>).
                                     _M_impl.super__Vector_impl_data._M_finish,&local_450);
          pmVar16 = std::
                    map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                    ::operator[](&this->beam_coord,&local_448);
          bVar27 = _Var17._M_current !=
                   (pmVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          lVar25 = 0;
          for (uVar26 = 0;
              pmVar16 = std::
                        map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                        ::operator[](&this->beam_coord,&local_448), p_Var24 = local_3f8,
              uVar26 < (ulong)((long)(pmVar16->super__Vector_base<double,_std::allocator<double>_>).
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)(pmVar16->super__Vector_base<double,_std::allocator<double>_>).
                                     _M_impl.super__Vector_impl_data._M_start >> 3) && !bVar27;
              uVar26 = uVar26 + 1) {
            pmVar16 = std::
                      map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                      ::operator[](&this->beam_coord,&local_448);
            dVar3 = (pmVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar26];
            bVar27 = local_450 < dVar3;
            if (local_450 < dVar3) {
              pmVar16 = std::
                        map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                        ::operator[](&this->beam_coord,&local_448);
              pmVar18 = std::
                        map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                        ::operator[](&this->beam_coord,&local_448);
              std::vector<double,_std::allocator<double>_>::insert
                        (pmVar16,(double *)
                                 ((long)(pmVar18->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data._M_start + lVar25),&local_450);
            }
            lVar25 = lVar25 + 8;
          }
          if (!bVar27) {
            pvVar15 = (vector<double,std::allocator<double>> *)
                      std::
                      map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                      ::operator[](&this->beam_coord,&local_448);
            iVar4._M_current = *(double **)(pvVar15 + 8);
            if (iVar4._M_current == *(double **)(pvVar15 + 0x10)) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (pvVar15,iVar4,&local_450);
            }
            else {
              *iVar4._M_current = local_450;
              *(double **)(pvVar15 + 8) = iVar4._M_current + 1;
            }
          }
        }
        insertYorder(this,local_450);
      }
      std::ifstream::close();
      pmVar19 = std::
                map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
                ::operator[](local_438,&local_43c);
      ppVar6 = (pmVar19->
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ppVar7 = (pmVar19->
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pmVar20 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](local_428,&local_43c);
      *pmVar20 = (mapped_type)((ulong)((long)ppVar7 - (long)ppVar6) >> 4);
      uVar26 = local_400 + 1;
      ppVar11 = (local_430->
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar23 = ((long)(local_430->
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar11 >> 3) *
               -0x3333333333333333;
    } while (uVar26 <= uVar23 && uVar23 - uVar26 != 0);
  }
  pdVar5 = (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar10 = (int)((ulong)((long)(this->xcoord).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->xcoord).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3);
  this->xdim = iVar10;
  iVar21 = (int)((ulong)((long)pdVar5 -
                        (long)(this->ycoord).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3);
  this->ydim = iVar21;
  this->nb_beamlets = iVar21 * iVar10;
  setActiveBeamlets(this,local_438);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
  std::ios_base::~ios_base(local_340);
  if (local_420 != local_410) {
    operator_delete(local_420);
  }
  if (local_3e0 != local_3d0) {
    operator_delete(local_3e0);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

Collimator::Collimator(vector < pair<int, string> >& coord_files) {
    ifstream myfile;
    string line, linec;
    stringstream ss;
    double x, y;
    bool flag;

    //nb_angles=coord_files.size();

    for (int i=0 ; i < coord_files.size(); i++) {
      // Open file
      int angle = coord_files[i].first;
      angles.push_back(angle);
      myfile.open(coord_files[i].second);
      if (!myfile.is_open())
        throw runtime_error("error reading file.");

      // Read lines of the file
      while (getline (myfile,line)) {
        flag=false;
        ss.clear(); ss.str(line);
        getline (ss,linec,'\t'); //the first number is discarded (beamlet id)
        getline (ss,linec,'\t');
        x = atof(linec.c_str());
        getline (ss,linec,'\t');
        y = atof(linec.c_str());


        angle_coord[angle].push_back(make_pair(x,y));

        if (beam_coord.find(x) == beam_coord.end()) {
          // New x coordinate
          beam_coord[x].push_back(y);
          insertXorder(x);
          insertYorder(y);
        } else {
          if (find(beam_coord[x].begin(), beam_coord[x].end(), y) != beam_coord[x].end())
            flag=true;
          // New y coordinate: insert in order
          for (int j=0; j < beam_coord[x].size() && !flag; j++) {
            if (beam_coord[x][j] > y) {
              beam_coord[x].insert(beam_coord[x].begin()+j, y);
              flag=true;
            }
          }
          if (!flag) beam_coord[x].push_back(y);
          insertYorder(y);
        }
      }
      myfile.close();
      nb_angle_beamlets[angle]=(angle_coord[angle].size());
    }
    xdim = xcoord.size();
    ydim = ycoord.size();
    nb_beamlets= xdim*ydim;
    //printCoordinates();

    setActiveBeamlets(angle_coord);
    //printActiveBeam();
  }